

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O0

void __thiscall sock2::operator()(sock2 *this,error_code *e)

{
  int iVar1;
  bool bVar2;
  ssize_t sVar3;
  ostream *poVar4;
  error_code *in_RSI;
  int *in_RDI;
  int n;
  char c;
  sock2 *in_stack_00000030;
  undefined1 local_11 [17];
  
  bVar2 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar4 = std::operator<<(poVar4,"!e");
    poVar4 = std::operator<<(poVar4," at ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x42);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  iVar1 = in_RDI[4];
  in_RDI[4] = iVar1 + 1;
  local_11[0] = (undefined1)iVar1;
  sVar3 = send(*in_RDI,local_11,1,0);
  if ((int)sVar3 != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar4 = std::operator<<(poVar4,"n==1");
    poVar4 = std::operator<<(poVar4," at ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x45);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  if (in_RDI[4] == 10) {
    shutdown(*in_RDI,2);
  }
  else {
    async_run(in_stack_00000030);
  }
  return;
}

Assistant:

void operator()(booster::system::error_code const &e)
	{
		TEST(!e);
		char c=counter++;
		int n = ::send(fd,&c,1,0);
		TEST(n==1);
		if(counter == 10) {
			#ifdef SHUT_RDWR
			shutdown(fd,SHUT_RDWR);
			#else
			shutdown(fd,SD_BOTH);
			#endif
		}
		else  {
			async_run();
		}

	}